

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O2

int Bbl_ManSopCheckUnique(Bbl_Man_t *p,char *pSop,int nVars,int nCubes,int iFunc)

{
  int *piVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  uint uVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  
  sVar6 = strlen(pSop);
  uVar7 = (int)sVar6 + 1;
  iVar9 = (uint)(0 < (int)(uVar7 & 0x80000003)) + (int)uVar7 / 4;
  iVar5 = nVars;
  if (0xf < nVars) {
    iVar5 = 0x10;
  }
  iVar4 = 0x10;
  if (nCubes < 0x10) {
    iVar4 = nCubes;
  }
  piVar1 = p->SopMap[iVar5] + iVar4;
  piVar8 = piVar1;
  while( true ) {
    lVar10 = (long)*piVar8;
    if (lVar10 == 0) {
      iVar5 = Bbl_ManCreateEntry(p,iFunc,*piVar1);
      *piVar1 = iVar5;
      return iFunc;
    }
    pcVar2 = p->pEnts->pArray;
    iVar5 = *(int *)(pcVar2 + lVar10);
    pcVar3 = p->pFncs->pArray;
    iVar4 = *(int *)(pcVar3 + iVar5);
    if (iVar4 != iVar9 && (nCubes < 0x10 && nVars < 0x10)) break;
    if ((iVar4 == iVar9) &&
       (iVar4 = bcmp(pcVar3 + (long)iVar5 + 4,pSop,(long)(int)uVar7), iVar4 == 0)) {
      return iVar5;
    }
    piVar8 = (int *)(pcVar2 + lVar10 + 4);
  }
  __assert_fail("nVars == 16 || nCubes == 16 || pFnc->nWords == nWords",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                ,0x3a7,"int Bbl_ManSopCheckUnique(Bbl_Man_t *, char *, int, int, int)");
}

Assistant:

int Bbl_ManSopCheckUnique( Bbl_Man_t * p, char * pSop, int nVars, int nCubes, int iFunc )
{
    Bbl_Fnc_t * pFnc;
    Bbl_Ent_t * pEnt;
    int h, Length = strlen(pSop) + 1;
    int nWords = (Length / 4 + (Length % 4 > 0));
    if ( nVars > 16 )   nVars = 16;
    if ( nCubes > 16 )  nCubes = 16;
//    if ( nVars == 16 && nCubes == 16 )
//        return iFunc;
    for ( h = p->SopMap[nVars][nCubes]; h; h = pEnt->iNext )
    {
        pEnt = Bbl_VecEnt( p->pEnts, h );
        pFnc = Bbl_VecFnc( p->pFncs, pEnt->iFunc );
        assert( nVars == 16 || nCubes == 16 || pFnc->nWords == nWords );
        if ( pFnc->nWords == nWords && memcmp( pFnc->pWords, pSop, Length ) == 0 )
            return pEnt->iFunc;
    }
    p->SopMap[nVars][nCubes] = Bbl_ManCreateEntry( p, iFunc, p->SopMap[nVars][nCubes] );
    return iFunc;
}